

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatExemplarLocation
          (TimeZoneFormat *this,TimeZone *tz,UnicodeString *name)

{
  TimeZoneNames *pTVar1;
  undefined4 uVar2;
  UChar *pUVar3;
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  char16_t *local_1b8;
  UChar *local_1a8;
  UnicodeString location;
  UnicodeString local_158;
  UChar locationBuf [128];
  
  UnicodeString::UnicodeString(&location,locationBuf,0,0x80);
  pUVar3 = ZoneMeta::getCanonicalCLDRID(tz);
  if (pUVar3 != (UChar *)0x0) {
    pTVar1 = this->fTimeZoneNames;
    local_1c0.p_ = pUVar3;
    UnicodeString::UnicodeString(&local_158,'\x01',&local_1c0,-1);
    (*(pTVar1->super_UObject)._vptr_UObject[0xb])(pTVar1,&local_158,&location);
    UnicodeString::~UnicodeString(&local_158);
    local_1a8 = local_1c0.p_;
  }
  uVar2 = location.fUnion.fFields.fLength;
  if (-1 < location.fUnion.fStackFields.fLengthAndFlags) {
    uVar2 = (int)location.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((int)uVar2 < 1) {
    pTVar1 = this->fTimeZoneNames;
    local_1c8.p_ = (char16_t *)UNKNOWN_ZONE_ID;
    UnicodeString::UnicodeString(&local_158,'\x01',&local_1c8,-1);
    (*(pTVar1->super_UObject)._vptr_UObject[0xb])(pTVar1,&local_158,&location);
    UnicodeString::~UnicodeString(&local_158);
    local_1b8 = local_1c8.p_;
    if (-1 < location.fUnion.fStackFields.fLengthAndFlags) {
      location.fUnion.fFields.fLength = (int)location.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (location.fUnion.fFields.fLength < 1) {
      UnicodeString::setTo(name,(char16_t *)UNKNOWN_LOCATION,-1);
      goto LAB_0020437c;
    }
  }
  UnicodeString::setTo(name,&location);
LAB_0020437c:
  UnicodeString::~UnicodeString(&location);
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatExemplarLocation(const TimeZone& tz, UnicodeString& name) const {
    UChar locationBuf[ZONE_NAME_U16_MAX];
    UnicodeString location(locationBuf, 0, UPRV_LENGTHOF(locationBuf));
    const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);

    if (canonicalID) {
        fTimeZoneNames->getExemplarLocationName(UnicodeString(TRUE, canonicalID, -1), location);
    }
    if (location.length() > 0) {
        name.setTo(location);
    } else {
        // Use "unknown" location
        fTimeZoneNames->getExemplarLocationName(UnicodeString(TRUE, UNKNOWN_ZONE_ID, -1), location);
        if (location.length() > 0) {
            name.setTo(location);
        } else {
            // last resort
            name.setTo(UNKNOWN_LOCATION, -1);
        }
    }
    return name;
}